

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

char * __thiscall amrex::BaseFab<char>::dataPtr(BaseFab<char> *this,int n)

{
  long lVar1;
  Long LVar2;
  int in_ESI;
  Box *in_RDI;
  char *local_8;
  
  if (*(long *)((in_RDI->bigend).vect + 1) == 0) {
    local_8 = (char *)0x0;
  }
  else {
    lVar1 = *(long *)((in_RDI->bigend).vect + 1);
    LVar2 = Box::numPts(in_RDI);
    local_8 = (char *)(lVar1 + in_ESI * LVar2);
  }
  return local_8;
}

Assistant:

const T* dataPtr (int n = 0) const noexcept {
        if (this->dptr) {
            return &(this->dptr[n*this->domain.numPts()]);
        } else {
            return nullptr;
        }
    }